

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginListBox(char *label,ImVec2 *size_arg)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiID id;
  ImGuiContext *g;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImRect bb;
  float local_78;
  ImVec2 local_58;
  ImRect local_50;
  ImRect local_40;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    id = GetID(label);
    IVar3 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar13 = IVar3.y;
    IVar1 = *size_arg;
    fVar8 = CalcItemWidth();
    fVar9 = GetTextLineHeightWithSpacing();
    fVar12 = (pIVar4->Style).FramePadding.y;
    IVar1 = CalcItemSize(IVar1,fVar8,fVar12 + fVar12 + fVar9 * 7.25);
    uVar6 = -(uint)(fVar13 <= (float)(int)IVar1.y);
    local_50.Min = (pIVar2->DC).CursorPos;
    local_50.Max.x = 0.0;
    local_78 = IVar3.x;
    fVar12 = local_50.Min.x;
    fVar9 = (float)(int)IVar1.x + fVar12;
    fVar8 = local_50.Min.y;
    fVar14 = (float)(uVar6 & (uint)(float)(int)IVar1.y | ~uVar6 & (uint)fVar13) + fVar8;
    local_40.Max.y = fVar14;
    local_40.Max.x = fVar9;
    if (0.0 < local_78) {
      local_50.Max.x = (pIVar4->Style).ItemInnerSpacing.x + local_78;
    }
    local_50.Max.x = local_50.Max.x + fVar9;
    local_50.Max.y = fVar14 + 0.0;
    (pIVar4->NextItemData).Flags = 0;
    local_40.Min = local_50.Min;
    bVar5 = IsRectVisible(&local_50.Min,&local_50.Max);
    if (bVar5) {
      BeginGroup();
      if (0.0 < local_78) {
        fVar10 = (pIVar4->Style).ItemInnerSpacing.x + fVar9;
        fVar11 = (pIVar4->Style).FramePadding.y + fVar8;
        IVar1.y = fVar11;
        IVar1.x = fVar10;
        RenderText(IVar1,label,(char *)0x0,true);
        local_78 = local_78 + fVar10;
        fVar13 = fVar13 + fVar11;
        IVar1 = (pIVar2->DC).CursorMaxPos;
        fVar10 = IVar1.x;
        fVar11 = IVar1.y;
        uVar6 = -(uint)(local_78 <= fVar10);
        uVar7 = -(uint)(fVar13 <= fVar11);
        (pIVar2->DC).CursorMaxPos =
             (ImVec2)(CONCAT44(~uVar7 & (uint)fVar13,~uVar6 & (uint)local_78) |
                     CONCAT44((uint)fVar11 & uVar7,(uint)fVar10 & uVar6));
      }
      local_58.y = fVar14 - fVar8;
      local_58.x = fVar9 - fVar12;
      BeginChildFrame(id,&local_58,0);
    }
    else {
      local_58.x = local_50.Max.x - local_50.Min.x;
      local_58.y = local_50.Max.y - local_50.Min.y;
      ItemSize(&local_58,(pIVar4->Style).FramePadding.y);
      ItemAdd(&local_50,0,&local_40);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::BeginListBox(const char* label, const ImVec2& size_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Size default to hold ~7.25 items.
    // Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    ImVec2 size = ImFloor(CalcItemSize(size_arg, CalcItemWidth(), GetTextLineHeightWithSpacing() * 7.25f + style.FramePadding.y * 2.0f));
    ImVec2 frame_size = ImVec2(size.x, ImMax(size.y, label_size.y));
    ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    g.NextItemData.ClearFlags();

    if (!IsRectVisible(bb.Min, bb.Max))
    {
        ItemSize(bb.GetSize(), style.FramePadding.y);
        ItemAdd(bb, 0, &frame_bb);
        return false;
    }

    // FIXME-OPT: We could omit the BeginGroup() if label_size.x but would need to omit the EndGroup() as well.
    BeginGroup();
    if (label_size.x > 0.0f)
    {
        ImVec2 label_pos = ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y);
        RenderText(label_pos, label);
        window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, label_pos + label_size);
    }

    BeginChildFrame(id, frame_bb.GetSize());
    return true;
}